

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::BasicNonMS<tcu::Vector<unsigned_int,_4>,_0>::Run
          (BasicNonMS<tcu::Vector<unsigned_int,_4>,_0> *this)

{
  CallLogWrapper *this_00;
  GLenum target;
  bool bVar1;
  int i;
  long lVar2;
  GLenum *pGVar3;
  ImageSizeMachine machine;
  ivec4 iStack_78;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  bVar1 = ShaderImageSizeBase::IsVSFSAvailable(&this->super_ShaderImageSizeBase,4,0);
  lVar2 = 0x10;
  if (bVar1) {
    this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    pGVar3 = &DAT_01b0a9d0;
    lVar2 = 0;
    do {
      target = *pGVar3;
      glu::CallLogWrapper::glBindTexture(this_00,target,this->m_texture[lVar2]);
      glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(this_00,target,10,0x8d70,0x200,0x80);
      glu::CallLogWrapper::glBindImageTexture
                (this_00,0,this->m_texture[lVar2],1,'\0',0,35000,0x8d70);
      lVar2 = lVar2 + 1;
      pGVar3 = pGVar3 + 1;
    } while (lVar2 != 4);
    ImageSizeMachine::ImageSizeMachine(&machine);
    iStack_78.m_data[0] = 0x100;
    iStack_78.m_data[1] = 0x40;
    iStack_78.m_data[2] = 0;
    iStack_78.m_data[3] = 0;
    uStack_68 = 0x800000008;
    uStack_60 = 4;
    uStack_58 = 0x1000000010;
    uStack_50 = 0;
    uStack_48 = 0x90000001f;
    uStack_40 = 0xc;
    lVar2 = glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                      ((ImageSizeMachine *)&machine,0,&iStack_78);
    ImageSizeMachine::~ImageSizeMachine(&machine);
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(1, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(3, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0), ivec4(16, 16, 0, 0), ivec4(31, 9, 12, 0) };
		return machine.Run<T>(STAGE, res);
	}